

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O2

double __thiscall Fossilize::CLIParser::next_double(CLIParser *this)

{
  allocator local_39;
  double local_38;
  string local_30;
  
  if (this->argc != 0) {
    std::__cxx11::string::string((string *)&local_30,*this->argv,&local_39);
    local_38 = std::__cxx11::stod(&local_30,(size_t *)0x0);
    std::__cxx11::string::_M_dispose();
    this->argc = this->argc + -1;
    this->argv = this->argv + 1;
    return local_38;
  }
  fwrite("Fossilize ERROR: Tried to parse double, but nothing left in arguments.\n",0x47,1,_stderr);
  fflush(_stderr);
  exit(1);
}

Assistant:

double CLIParser::next_double()
{
	if (!argc)
	{
		LOGE("Tried to parse double, but nothing left in arguments.\n");
		exit(EXIT_FAILURE);
	}

	double val = stod(*argv);

	argc--;
	argv++;

	return val;
}